

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span-main.t.hpp
# Opt level: O1

ostream * nonstd::span_lite::operator<<(ostream *os,span<unsigned_char,_18446744073709551615UL> *v)

{
  lest *plVar1;
  ostream *poVar2;
  char *chr;
  lest local_31;
  string local_30;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"[span:",6);
  if (v->size_ == 0) {
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"[empty]","");
  }
  else {
    plVar1 = (lest *)span<unsigned_char,_18446744073709551615UL>::operator[](v,0);
    local_31 = *plVar1;
    lest::to_string_abi_cxx11_(&local_30,&local_31,chr);
  }
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,local_30._M_dataplus._M_p,local_30._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"]",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return poVar2;
}

Assistant:

inline std::ostream & operator<<( std::ostream & os, span<T> const & v )
{
    using lest::to_string;
    return os << "[span:" << (v.empty() ? "[empty]" : to_string( v[0] ) ) << "]";
}